

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O2

UBool __thiscall
icu_63::CollationWeights::allocWeightsInMinLengthRanges
          (CollationWeights *this,int32_t n,int32_t minLength)

{
  UBool UVar1;
  uint32_t uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint32_t *puVar6;
  int32_t iVar7;
  WeightRange *range;
  int iVar8;
  int32_t *piVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint32_t uVar13;
  
  range = this->ranges;
  uVar5 = 0;
  uVar3 = (ulong)(uint)this->rangeCount;
  if (this->rangeCount < 1) {
    uVar3 = uVar5;
  }
  piVar9 = &this->ranges[0].count;
  iVar8 = 0;
  do {
    if (uVar3 == uVar5) {
LAB_0023fa49:
      iVar10 = this->maxBytes[(long)minLength + 1] - this->minBytes[(long)minLength + 1];
      iVar11 = iVar10 + 1;
      if (iVar11 * iVar8 < n) {
        UVar1 = '\0';
      }
      else {
        uVar2 = this->ranges[0].start;
        uVar13 = this->ranges[0].end;
        puVar6 = &this->ranges[1].end;
        for (uVar5 = 1; uVar5 < uVar3; uVar5 = uVar5 + 1) {
          if (((WeightRange *)(puVar6 + -1))->start < uVar2) {
            uVar2 = ((WeightRange *)(puVar6 + -1))->start;
          }
          if (uVar13 < *puVar6) {
            uVar13 = *puVar6;
          }
          puVar6 = puVar6 + 4;
        }
        iVar10 = (n - iVar8) / iVar10;
        iVar12 = iVar8 - iVar10;
        if ((iVar10 == 0) || (iVar11 * iVar10 + iVar12 < n)) {
          iVar10 = iVar10 + 1;
          iVar12 = iVar12 + -1;
        }
        range->start = uVar2;
        if (iVar12 == 0) {
          this->ranges[0].end = uVar13;
          iVar7 = 1;
          lVar4 = 0x38;
        }
        else {
          uVar2 = incWeightByOffset(this,uVar2,minLength,iVar12 + -1);
          this->ranges[0].end = uVar2;
          this->ranges[0].count = iVar12;
          uVar2 = incWeight(this,uVar2,minLength);
          range = this->ranges + 1;
          this->ranges[1].start = uVar2;
          this->ranges[1].end = uVar13;
          this->ranges[1].length = minLength;
          iVar7 = 2;
          lVar4 = 0x48;
          iVar8 = iVar10;
        }
        *(int *)((long)this->minBytes + lVar4 + -4) = iVar8;
        lengthenRange(this,range);
        this->rangeCount = iVar7;
        UVar1 = '\x01';
      }
      return UVar1;
    }
    if (piVar9[-1] != minLength) {
      uVar3 = uVar5 & 0xffffffff;
      goto LAB_0023fa49;
    }
    iVar8 = iVar8 + *piVar9;
    uVar5 = uVar5 + 1;
    piVar9 = piVar9 + 4;
  } while( true );
}

Assistant:

UBool
CollationWeights::allocWeightsInMinLengthRanges(int32_t n, int32_t minLength) {
    // See if the minLength ranges have enough weights
    // when we split one and lengthen the following ones.
    int32_t count = 0;
    int32_t minLengthRangeCount;
    for(minLengthRangeCount = 0;
            minLengthRangeCount < rangeCount &&
                ranges[minLengthRangeCount].length == minLength;
            ++minLengthRangeCount) {
        count += ranges[minLengthRangeCount].count;
    }

    int32_t nextCountBytes = countBytes(minLength + 1);
    if(n > count * nextCountBytes) { return FALSE; }

    // Use the minLength ranges. Merge them, and then split again as necessary.
    uint32_t start = ranges[0].start;
    uint32_t end = ranges[0].end;
    for(int32_t i = 1; i < minLengthRangeCount; ++i) {
        if(ranges[i].start < start) { start = ranges[i].start; }
        if(ranges[i].end > end) { end = ranges[i].end; }
    }

    // Calculate how to split the range between minLength (count1) and minLength+1 (count2).
    // Goal:
    //   count1 + count2 * nextCountBytes = n
    //   count1 + count2 = count
    // These turn into
    //   (count - count2) + count2 * nextCountBytes = n
    // and then into the following count1 & count2 computations.
    int32_t count2 = (n - count) / (nextCountBytes - 1);  // number of weights to be lengthened
    int32_t count1 = count - count2;  // number of minLength weights
    if(count2 == 0 || (count1 + count2 * nextCountBytes) < n) {
        // round up
        ++count2;
        --count1;
        U_ASSERT((count1 + count2 * nextCountBytes) >= n);
    }

    ranges[0].start = start;

    if(count1 == 0) {
        // Make one long range.
        ranges[0].end = end;
        ranges[0].count = count;
        lengthenRange(ranges[0]);
        rangeCount = 1;
    } else {
        // Split the range, lengthen the second part.
#ifdef UCOL_DEBUG
        printf("split the range number %ld (out of %ld minLength ranges) by %ld:%ld\n",
               splitRange, rangeCount, count1, count2);
#endif

        // Next start = start + count1. First end = 1 before that.
        ranges[0].end = incWeightByOffset(start, minLength, count1 - 1);
        ranges[0].count = count1;

        ranges[1].start = incWeight(ranges[0].end, minLength);
        ranges[1].end = end;
        ranges[1].length = minLength;  // +1 when lengthened
        ranges[1].count = count2;  // *countBytes when lengthened
        lengthenRange(ranges[1]);
        rangeCount = 2;
    }
    return TRUE;
}